

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall capnp::_::ReaderArena::~ReaderArena(ReaderArena *this)

{
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
  *paVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Entry *pEVar5;
  RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *pRVar6;
  Entry *pEVar7;
  
  if ((this->moreSegments).value.ptr.isSet == true) {
    pHVar2 = (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.ptr;
    if (pHVar2 != (HashBucket *)0x0) {
      sVar3 = *(size_t *)
               ((long)&(this->moreSegments).value.ptr.field_1.value.table.indexes.buckets + 8);
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
      *(size_t *)((long)&(this->moreSegments).value.ptr.field_1.value.table.indexes.buckets + 8) = 0
      ;
      pAVar4 = *(ArrayDisposer **)
                ((long)&(this->moreSegments).value.ptr.field_1.value.table.indexes.buckets + 0x10);
      (*(code *)**(undefined8 **)pAVar4)(pAVar4,pHVar2,8,sVar3,sVar3,0);
    }
    paVar1 = &(this->moreSegments).value.ptr.field_1;
    pEVar5 = (paVar1->value).table.rows.builder.ptr;
    if (pEVar5 != (Entry *)0x0) {
      pRVar6 = *(RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> **
                )((long)&(this->moreSegments).value.ptr.field_1.value.table.rows.builder + 8);
      pEVar7 = *(Entry **)
                ((long)&(this->moreSegments).value.ptr.field_1.value.table.rows.builder + 0x10);
      (paVar1->value).table.rows.builder.ptr = (Entry *)0x0;
      *(RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> **)
       ((long)&(this->moreSegments).value.ptr.field_1.value.table.rows.builder + 8) =
           (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)0x0;
      *(Entry **)((long)&(this->moreSegments).value.ptr.field_1.value.table.rows.builder + 0x10) =
           (Entry *)0x0;
      pAVar4 = *(ArrayDisposer **)
                ((long)&(this->moreSegments).value.ptr.field_1.value.table.rows.builder + 0x18);
      (*(code *)**(undefined8 **)pAVar4)
                (pAVar4,pEVar5,0x18,((long)pRVar6 - (long)pEVar5 >> 3) * -0x5555555555555555,
                 ((long)pEVar7 - (long)pEVar5 >> 3) * -0x5555555555555555,
                 kj::ArrayDisposer::
                 Dispose_<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::Entry>
                 ::destruct);
    }
  }
  kj::_::Mutex::~Mutex(&(this->moreSegments).mutex);
  return;
}

Assistant:

ReaderArena::~ReaderArena() noexcept(false) {}